

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

int32_t find_prefab(ecs_type_t type,int32_t n)

{
  int32_t iVar1;
  void *pvVar2;
  ecs_entity_t e;
  ecs_entity_t *buffer;
  int local_20;
  int32_t count;
  int32_t i;
  int32_t n_local;
  ecs_type_t type_local;
  
  iVar1 = ecs_vector_count(type);
  pvVar2 = _ecs_vector_first(type,8,0x10);
  local_20 = n + 1;
  while( true ) {
    if (iVar1 <= local_20) {
      return -1;
    }
    if ((*(ulong *)((long)pvVar2 + (long)local_20 * 8) & 0xff00000000000000) == 0xfe00000000000000)
    break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static
int32_t find_prefab(
    ecs_type_t type,
    int32_t n)
{
    int32_t i, count = ecs_vector_count(type);
    ecs_entity_t *buffer = ecs_vector_first(type, ecs_entity_t);

    for (i = n + 1; i < count; i ++) {
        ecs_entity_t e = buffer[i];
        if (ECS_HAS_ROLE(e, INSTANCEOF)) {
            return i;
        }
    }

    return -1;
}